

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnicode.c
# Opt level: O2

JL_STATUS JlUnicodeCharFromUtf8
                    (char *Utf8String,size_t Utf8StringLength,uint32_t *pUnicodeValue,
                    size_t *pNumBytesUsed)

{
  JL_STATUS JVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  ulong uStack_8;
  
  bVar3 = *Utf8String;
  JVar1 = JL_STATUS_INVALID_DATA;
  if ((bVar3 & 0xf8) == 0xf0) {
    bVar3 = bVar3 & 7;
    uStack_8 = 4;
  }
  else if ((bVar3 & 0xf0) == 0xe0) {
    bVar3 = bVar3 & 0xf;
    uStack_8 = 3;
  }
  else if ((bVar3 & 0xe0) == 0xc0) {
    bVar3 = bVar3 & 0x1f;
    uStack_8 = 2;
  }
  else {
    if ((char)bVar3 < '\0') {
      return JL_STATUS_INVALID_DATA;
    }
    uStack_8 = 1;
  }
  if (uStack_8 <= Utf8StringLength) {
    uVar2 = (uint)bVar3;
    for (lVar4 = 1; (uint)lVar4 < (uint)uStack_8; lVar4 = lVar4 + 1) {
      if (((byte)Utf8String[lVar4] & 0xffffffc0) != 0x80) {
        return JL_STATUS_INVALID_DATA;
      }
      uVar2 = uVar2 << 6 | (byte)Utf8String[lVar4] & 0x3f;
    }
    if (uVar2 - 0xe000 < 0xfffff800 && uVar2 < 0x110000) {
      *pUnicodeValue = uVar2;
      *pNumBytesUsed = uStack_8;
      JVar1 = JL_STATUS_SUCCESS;
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlUnicodeCharFromUtf8
    (
        char const*     Utf8String,
        size_t          Utf8StringLength,
        uint32_t*       pUnicodeValue,
        size_t*         pNumBytesUsed
    )
{
    // Determine number of bytes needed.
    // We assume Utf8StringLength is at least 1 byte long.
    size_t numBytesNeeded = 0;
    uint8_t topBits = 0;
    JL_STATUS jlStatus;

    if( 0xf0 == (Utf8String[0] & 0xf8) )
    {
        numBytesNeeded = 4;
        topBits = Utf8String[0] & 0x07;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xe0 == (Utf8String[0] & 0xf0) )
    {
        numBytesNeeded = 3;
        topBits = Utf8String[0] & 0x0f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xc0 == (Utf8String[0] & 0xe0) )
    {
        numBytesNeeded = 2;
        topBits = Utf8String[0] & 0x1f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0x00 == (Utf8String[0] & 0x80) )
    {
        numBytesNeeded = 1;
        topBits = Utf8String[0] & 0x7f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Is either a continuation character without a start, or an invalid start such as
        // a 5 or 6 byte character which is not valid in UTF8
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( numBytesNeeded <= Utf8StringLength )
        {
            // Start with the top bits
            uint32_t unicode = topBits;

            /// Now slide in the next bits in sets of 6 for each continuation character
            for( uint32_t i=1; i<numBytesNeeded; i++ )
            {
                // Verify that this is a continuation utf8 char
                if( 0x80 == (Utf8String[i] & 0xc0) )
                {
                    unicode <<= 6;
                    unicode |= (Utf8String[i] & 0x3f );
                }
                else
                {
                    // Not a continuation character. This is invalid UTF8
                    jlStatus = JL_STATUS_INVALID_DATA;
                    break;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if(     unicode <= 0x10ffff
                    &&  (unicode < 0xd800 || unicode > 0xdfff) )
                {
                    // Valid unicode range (We don't allow UTF16 surrogate pairs to appear in the utf8)
                    *pUnicodeValue = unicode;
                    *pNumBytesUsed = numBytesNeeded;
                }
                else
                {
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
            }
        }
        else
        {
            // Not enough bytes to complete utf8 character
            jlStatus = JL_STATUS_INVALID_DATA;
        }
    }

    return jlStatus;
}